

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

void __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
async_read_some(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this,
               vector<char,_std::allocator<char>_> *data,size_t max_sz,
               function<void_(const_std::error_code_&,_unsigned_long)> *cb)

{
  pointer pcVar1;
  mutable_buffers_1 local_10;
  
  pcVar1 = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_10.super_mutable_buffer.size_ =
       (long)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_finish - (long)pcVar1;
  local_10.super_mutable_buffer.data_ = (pointer)0x0;
  if (local_10.super_mutable_buffer.size_ != 0) {
    local_10.super_mutable_buffer.data_ = pcVar1;
  }
  if (max_sz <= local_10.super_mutable_buffer.size_) {
    local_10.super_mutable_buffer.size_ = max_sz;
  }
  ::asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::
  async_read_some<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>_&>
            (&this->socket_,&local_10,cb);
  return;
}

Assistant:

void async_read_some(
        std::vector<char>& data,
        std::size_t max_sz,
        std::function<void(const std::error_code&, std::size_t)> cb)
    {
        socket_.async_read_some(asio::buffer(data, max_sz), cb);
    }